

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.hpp
# Opt level: O2

void __thiscall
generator::tag_b_t<cfgfile::string_trait_t>::tag_b_t
          (tag_b_t<cfgfile::string_trait_t> *this,b_t *cfg)

{
  allocator local_59;
  string local_58 [32];
  string_t local_38;
  
  std::__cxx11::string::string(local_58,"integer_field",&local_59);
  std::__cxx11::string::string((string *)&local_38,local_58);
  cfgfile::tag_scalar_t<int,_cfgfile::string_trait_t>::tag_scalar_t
            (&this->super_tag_scalar_t<int,_cfgfile::string_trait_t>,&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  (this->super_tag_scalar_t<int,_cfgfile::string_trait_t>).super_tag_t<cfgfile::string_trait_t>.
  _vptr_tag_t = (_func_int **)&PTR__tag_b_t_0010da18;
  std::__cxx11::string::string(local_58,"a_vector",&local_59);
  std::__cxx11::string::string((string *)&local_38,local_58);
  cfgfile::
  tag_vector_of_tags_t<generator::tag_a_t<cfgfile::string_trait_t>,_cfgfile::string_trait_t>::
  tag_vector_of_tags_t(&this->m_a_vector,(tag_t<cfgfile::string_trait_t> *)this,&local_38,false);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string(local_58);
  set_cfg(this,cfg);
  return;
}

Assistant:

explicit tag_b_t( const b_t & cfg )
		:	cfgfile::tag_scalar_t< int, Trait >( Trait::from_ascii( "integer_field" ), true )
		,	m_a_vector( *this, Trait::from_ascii( "a_vector" ), false )
	{
		set_cfg( cfg );
	}